

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_record.c
# Opt level: O0

void rec_idx_abc(jit_State *J,TRef asizeref,TRef ikey,uint32_t asize)

{
  IRRef1 IVar1;
  IRRef1 IVar2;
  TRef TVar3;
  IRRef1 local_8c;
  ushort local_78;
  int32_t stop;
  IRRef ofsref;
  int32_t ofs;
  IRIns *ir;
  IRRef ref;
  uint32_t asize_local;
  TRef ikey_local;
  TRef asizeref_local;
  jit_State *J_local;
  
  IVar2 = (IRRef1)asizeref;
  if ((J->flags & 0xc00000) == 0xc00000) {
    ir._0_4_ = ikey & 0xffff;
    _ofsref = (J->cur).ir + (uint)ir;
    stop = 0;
    local_78 = 0;
    if (((_ofsref->field_1).o == ')') && ((_ofsref->field_0).op2 < 0x8000)) {
      local_78 = (_ofsref->field_0).op2;
      stop = (J->cur).ir[local_78].i;
      ir._0_4_ = (uint)(_ofsref->field_0).op1;
      _ofsref = (J->cur).ir + (uint)ir;
    }
    if (((uint)ir == (J->scev).idx) &&
       ((ulong)((long)(int)J->L->base[(long)(int)((_ofsref->field_0).op1 + 1) - (ulong)J->baseslot].
                           n + (long)stop) < (ulong)asize)) {
      if (stop == 0) {
        local_8c = (J->scev).stop;
      }
      else {
        IVar1 = (J->scev).stop;
        (J->fold).ins.field_0.ot = 0x2913;
        (J->fold).ins.field_0.op1 = IVar1;
        (J->fold).ins.field_0.op2 = local_78;
        TVar3 = lj_opt_fold(J);
        local_8c = (IRRef1)TVar3;
      }
      (J->fold).ins.field_0.ot = 0xa85;
      (J->fold).ins.field_0.op1 = IVar2;
      (J->fold).ins.field_0.op2 = local_8c;
      lj_opt_fold(J);
      if ((((J->scev).dir != '\0') && ((J->scev).start != 0)) &&
         (-1 < (long)(J->cur).ir[(J->scev).start].i + (long)stop)) {
        return;
      }
      (J->fold).ins.field_0.ot = 0xa85;
      (J->fold).ins.field_0.op1 = IVar2;
      (J->fold).ins.field_0.op2 = (IRRef1)ikey;
      lj_opt_fold(J);
      return;
    }
  }
  (J->fold).ins.field_0.ot = 0xa93;
  (J->fold).ins.field_0.op1 = IVar2;
  (J->fold).ins.field_0.op2 = (IRRef1)ikey;
  lj_opt_fold(J);
  return;
}

Assistant:

static void rec_idx_abc(jit_State *J, TRef asizeref, TRef ikey, uint32_t asize)
{
  /* Try to emit invariant bounds checks. */
  if ((J->flags & (JIT_F_OPT_LOOP|JIT_F_OPT_ABC)) ==
      (JIT_F_OPT_LOOP|JIT_F_OPT_ABC)) {
    IRRef ref = tref_ref(ikey);
    IRIns *ir = IR(ref);
    int32_t ofs = 0;
    IRRef ofsref = 0;
    /* Handle constant offsets. */
    if (ir->o == IR_ADD && irref_isk(ir->op2)) {
      ofsref = ir->op2;
      ofs = IR(ofsref)->i;
      ref = ir->op1;
      ir = IR(ref);
    }
    /* Got scalar evolution analysis results for this reference? */
    if (ref == J->scev.idx) {
      int32_t stop;
      lj_assertJ(irt_isint(J->scev.t) && ir->o == IR_SLOAD,
		 "only int SCEV supported");
      stop = numberVint(&(J->L->base - J->baseslot)[ir->op1 + FORL_STOP]);
      /* Runtime value for stop of loop is within bounds? */
      if ((uint64_t)stop + ofs < (uint64_t)asize) {
	/* Emit invariant bounds check for stop. */
	emitir(IRTG(IR_ABC, IRT_P32), asizeref, ofs == 0 ? J->scev.stop :
	       emitir(IRTI(IR_ADD), J->scev.stop, ofsref));
	/* Emit invariant bounds check for start, if not const or negative. */
	if (!(J->scev.dir && J->scev.start &&
	      (int64_t)IR(J->scev.start)->i + ofs >= 0))
	  emitir(IRTG(IR_ABC, IRT_P32), asizeref, ikey);
	return;
      }
    }
  }
  emitir(IRTGI(IR_ABC), asizeref, ikey);  /* Emit regular bounds check. */
}